

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

void tcu::astc::anon_unknown_0::setASTCErrorColorBlock
               (void *dst,int blockWidth,int blockHeight,bool isSRGB)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined7 in_register_00000009;
  long lVar3;
  
  uVar2 = 0;
  if (0 < blockWidth * blockHeight) {
    uVar2 = (ulong)(uint)(blockWidth * blockHeight);
  }
  if ((int)CONCAT71(in_register_00000009,isSRGB) == 0) {
    for (lVar3 = 0; uVar2 * 4 != lVar3; lVar3 = lVar3 + 4) {
      puVar1 = (undefined8 *)((long)dst + (long)(int)lVar3 * 4);
      *puVar1 = 0x3f800000;
      puVar1[1] = &DAT_3f8000003f800000;
    }
  }
  else {
    for (lVar3 = 0; uVar2 * 4 != lVar3; lVar3 = lVar3 + 4) {
      *(undefined4 *)((long)dst + (long)(int)lVar3) = 0xffff00ff;
    }
  }
  return;
}

Assistant:

inline void setASTCErrorColorBlock (void* dst, int blockWidth, int blockHeight, bool isSRGB)
{
	if (isSRGB)
	{
		deUint8* const dstU = (deUint8*)dst;

		for (int i = 0; i < blockWidth*blockHeight; i++)
		{
			dstU[4*i + 0] = 0xff;
			dstU[4*i + 1] = 0;
			dstU[4*i + 2] = 0xff;
			dstU[4*i + 3] = 0xff;
		}
	}
	else
	{
		float* const dstF = (float*)dst;

		for (int i = 0; i < blockWidth*blockHeight; i++)
		{
			dstF[4*i + 0] = 1.0f;
			dstF[4*i + 1] = 0.0f;
			dstF[4*i + 2] = 1.0f;
			dstF[4*i + 3] = 1.0f;
		}
	}
}